

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void write_fp_dreg_aarch64(DisasContext_conflict1 *s,int reg,TCGv_i64 v)

{
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(v + (long)tcg_ctx),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(ulong)(reg * 0x100 + 0xc10));
  clear_vec_high(s,false,reg);
  return;
}

Assistant:

void write_fp_dreg(DisasContext *s, int reg, TCGv_i64 v)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned ofs = fp_reg_offset(s, reg, MO_64);

    tcg_gen_st_i64(tcg_ctx, v, tcg_ctx->cpu_env, ofs);
    clear_vec_high(s, false, reg);
}